

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

int yylex_RAW(void)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  size_t i;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  while( true ) {
    while ((iVar1 = peek(), iVar1 == 9 || (iVar1 == 0x20))) {
      shiftChar();
    }
    if (iVar1 != 0x5c) {
      i = 0;
      uVar6 = 0;
      goto LAB_0010d764;
    }
    shiftChar();
    uVar2 = peek();
    uVar5 = (ulong)uVar2;
    if ((0x20 < uVar2) || ((0x100002600U >> (uVar5 & 0x3f) & 1) == 0)) break;
    readLineContinuation();
  }
  i = 0;
  uVar6 = 0;
LAB_0010d84c:
  iVar1 = (int)uVar5;
  if (iVar1 < 0x5c) {
    uVar4 = (ulong)(iVar1 + 1U);
    if (iVar1 + 1U < 0x2e) {
      if ((0x260800000000U >> (uVar4 & 0x3f) & 1) != 0) goto switchD_0010d7a6_caseD_24;
      if ((0x200004800U >> (uVar4 & 0x3f) & 1) != 0) {
        readLineContinuation();
        goto LAB_0010d764;
      }
      if (uVar4 == 0) {
        error("Illegal character escape at end of input\n");
        uVar5 = 0x5c;
        goto switchD_0010d7a6_caseD_24;
      }
    }
  }
  else if (iVar1 < 0x74) {
    if (iVar1 == 0x5c) goto switchD_0010d7a6_caseD_24;
    if (iVar1 == 0x6e) {
      uVar5 = 10;
      goto switchD_0010d7a6_caseD_24;
    }
    if (iVar1 == 0x72) {
      uVar5 = 0xd;
      goto switchD_0010d7a6_caseD_24;
    }
  }
  else {
    if (iVar1 == 0x74) {
      uVar5 = 9;
      goto switchD_0010d7a6_caseD_24;
    }
    if ((iVar1 == 0x7b) || (iVar1 == 0x7d)) goto switchD_0010d7a6_caseD_24;
  }
  printChar(iVar1);
  error("Illegal character escape %s\n");
switchD_0010d7a6_caseD_24:
  do {
    if (i < 0x100) {
      yylval.symName[i] = (char)uVar5;
      i = i + 1;
    }
    shiftChar();
LAB_0010d764:
    while (uVar2 = peek(), uVar2 == 0x2f) {
      shiftChar();
      iVar1 = peek();
      if (iVar1 == 0x2a) {
        shiftChar();
        discardBlockComment();
      }
      else if (i < 0x100) {
        yylval.symName[i] = '/';
        i = i + 1;
      }
    }
    uVar5 = (ulong)uVar2;
    if (0x21 < (int)uVar2) {
      switch(uVar2) {
      case 0x22:
        shiftChar();
        bVar7 = false;
        goto LAB_0010d7e1;
      case 0x23:
        goto switchD_0010d7a6_caseD_23;
      case 0x24:
      case 0x25:
      case 0x26:
      case 0x27:
      case 0x2a:
      case 0x2b:
        goto switchD_0010d7a6_caseD_24;
      case 0x28:
        uVar6 = uVar6 + (uVar6 < 0xffffffff);
        uVar5 = 0x28;
        goto switchD_0010d7a6_caseD_24;
      case 0x29:
        bVar7 = uVar6 == 0;
        uVar6 = uVar6 - 1;
        if (bVar7) {
          uVar6 = 0;
        }
        uVar5 = 0x29;
        goto switchD_0010d7a6_caseD_24;
      case 0x2c:
        uVar5 = 0x2c;
        if (uVar6 != 0) goto switchD_0010d7a6_caseD_24;
        uVar2 = 0x2c;
        break;
      default:
        if (uVar2 != 0x3b) {
          if (uVar2 == 0x5c) {
            shiftChar();
            uVar2 = peek();
            uVar5 = (ulong)uVar2;
            goto LAB_0010d84c;
          }
          goto switchD_0010d7a6_caseD_24;
        }
        discardComment();
        uVar2 = peek();
      }
LAB_0010d92a:
      if (i == 0) goto LAB_0010d965;
      if (i == 0x100) {
        warning(WARNING_LONG_STR,"Macro argument too long\n");
        i = 0xff;
      }
      goto LAB_0010d950;
    }
    if (((uVar2 == 0xffffffff) || (uVar2 == 10)) || (uVar2 == 0xd)) goto LAB_0010d92a;
  } while( true );
switchD_0010d7a6_caseD_23:
  if (i < 0x100) {
    yylval.symName[i] = '#';
    i = i + 1;
  }
  shiftChar();
  iVar1 = peek();
  if (iVar1 == 0x22) {
    shiftChar();
    bVar7 = true;
LAB_0010d7e1:
    i = appendStringLiteral(i,bVar7);
  }
  goto LAB_0010d764;
LAB_0010d950:
  if (((&DAT_00128357)[i] != ' ') && ((&DAT_00128357)[i] != '\t')) {
    yylval.symName[i] = '\0';
    iVar1 = 4;
    if (uVar2 != 0x2c) {
      return 4;
    }
    goto LAB_0010d9c2;
  }
  i = i - 1;
  if (i == 0) {
LAB_0010d965:
    yylval.symName[0] = '\0';
    iVar1 = 4;
    if (uVar2 != 0x2c) {
      lexerState->mode = LEXER_NORMAL;
      if ((uVar2 != 0xd) && (uVar2 != 10)) {
        return 0;
      }
      shiftChar();
      if (uVar2 != 0xd) {
        return 0xd;
      }
      iVar3 = peek();
      iVar1 = 0xd;
      if (iVar3 != 10) {
        return 0xd;
      }
    }
LAB_0010d9c2:
    shiftChar();
    return iVar1;
  }
  goto LAB_0010d950;
}

Assistant:

static int yylex_RAW(void)
{
	// This is essentially a modified `appendStringLiteral`
	size_t parenDepth = 0;
	size_t i = 0;
	int c;

	// Trim left whitespace (stops at a block comment)
	for (;;) {
		c = peek();
		if (isWhitespace(c)) {
			shiftChar();
		} else if (c == '\\') {
			shiftChar();
			c = peek();
			// If not a line continuation, handle as a normal char
			if (!isWhitespace(c) && c != '\n' && c != '\r')
				goto backslash;
			// Line continuations count as "whitespace"
			readLineContinuation();
		} else {
			break;
		}
	}

	for (;;) {
		c = peek();

		switch (c) {
		case '"': // String literals inside macro args
			shiftChar();
			i = appendStringLiteral(i, false);
			break;

		case '#': // Raw string literals inside macro args
			append_yylval_string(c);
			shiftChar();
			if (peek() == '"') {
				shiftChar();
				i = appendStringLiteral(i, true);
			}
			break;

		case ';': // Comments inside macro args
			discardComment();
			c = peek();
			// fallthrough
		case '\r': // End of line
		case '\n':
		case EOF:
			goto finish;

		case '/': // Block comments inside macro args
			shiftChar();
			if (peek() == '*') {
				shiftChar();
				discardBlockComment();
				continue;
			}
			append_yylval_string(c); // Append the slash
			break;

		case ',': // End of macro arg
			if (parenDepth == 0)
				goto finish;
			goto append;

		case '(': // Open parentheses inside macro args
			if (parenDepth < UINT_MAX)
				parenDepth++;
			goto append;

		case ')': // Close parentheses inside macro args
			if (parenDepth > 0)
				parenDepth--;
			goto append;

		case '\\': // Character escape
			shiftChar();
			c = peek();

backslash:
			switch (c) {
			case ',': // Escapes only valid inside a macro arg
			case '(':
			case ')':
			case '\\': // Escapes shared with string literals
			case '"':
			case '{':
			case '}':
				break;

			case 'n':
				c = '\n';
				break;
			case 'r':
				c = '\r';
				break;
			case 't':
				c = '\t';
				break;

			case ' ':
			case '\r':
			case '\n':
				readLineContinuation();
				continue;

			case EOF: // Can't really print that one
				error("Illegal character escape at end of input\n");
				c = '\\';
				break;

			// Macro args were already handled by peek, so '\@',
			// '\#', and '\0'-'\9' should not occur here.

			default:
				error("Illegal character escape %s\n", printChar(c));
				break;
			}
			// fallthrough

		default: // Regular characters will just get copied
append:
			append_yylval_string(c);
			shiftChar();
			break;
		}
	}

finish:
	if (i == sizeof(yylval.string)) {
		i--;
		warning(WARNING_LONG_STR, "Macro argument too long\n");
	}
	// Trim right whitespace
	while (i && isWhitespace(yylval.string[i - 1]))
		i--;
	yylval.string[i] = '\0';

	// Returning T_COMMAs to the parser would mean that two consecutive commas
	// (i.e. an empty argument) need to return two different tokens (T_STRING
	// then T_COMMA) without advancing the read. To avoid this, commas in raw
	// mode end the current macro argument but are not tokenized themselves.
	if (c == ',') {
		shiftChar();
		return T_STRING;
	}

	// The last argument may end in a trailing comma, newline, or EOF.
	// To allow trailing commas, raw mode will continue after the last
	// argument, immediately lexing the newline or EOF again (i.e. with
	// an empty raw string before it). This will not be treated as a
	// macro argument. To pass an empty last argument, use a second
	// trailing comma.
	if (i > 0)
		return T_STRING;
	lexer_SetMode(LEXER_NORMAL);

	if (c == '\r' || c == '\n') {
		shiftChar();
		handleCRLF(c);
		return T_NEWLINE;
	}

	return T_EOF;
}